

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue436(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  size_t __size;
  char *buf;
  roaring_bitmap_t *r2;
  uint32_t val;
  
  r = roaring_bitmap_create_with_capacity(0);
  roaring_bitmap_add_range_closed(r,0x4cff,0x3ffb4);
  val = 0xfffffffe;
  do {
    val = val + 2;
    roaring_bitmap_add(r,val);
  } while (val < 0xfffe);
  roaring_bitmap_printf_describe(r);
  roaring_bitmap_remove_range_closed(r,0x17ff,0xffe1);
  __size = roaring_bitmap_portable_size_in_bytes(r);
  buf = (char *)roaring_malloc(__size);
  roaring_bitmap_portable_serialize(r,buf);
  r2 = roaring_bitmap_portable_deserialize_safe(buf,__size);
  _Var1 = roaring_bitmap_equals(r,r2);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(b1, b2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x7d);
  roaring_bitmap_free(r2);
  roaring_bitmap_free(r);
  roaring_free(buf);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}